

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O2

void fail_if_leftover_values(char *test_name)

{
  ListNode *head;
  undefined8 *puVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  ListNode *node;
  ListNode *pLVar5;
  int quit_application;
  char *pcVar6;
  long lVar7;
  long *in_FS_OFFSET;
  
  lVar7 = *in_FS_OFFSET;
  remove_always_return_values((ListNode *)(lVar7 + -400),1);
  sVar3 = check_for_leftover_values
                    ((ListNode *)(lVar7 + -400),"%s() has remaining non-returned values.\n",1);
  remove_always_return_values((ListNode *)(lVar7 + -0x140),2);
  sVar4 = check_for_leftover_values
                    ((ListNode *)(lVar7 + -0x140),
                     "\'%s\' parameter still has values that haven\'t been checked.\n",2);
  head = (ListNode *)(lVar7 + -0x160);
  _assert_true((unsigned_long)head,"map_head",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O2/_deps/cmocka-src/src/cmocka.c"
               ,0x34c);
  pLVar5 = *(ListNode **)(lVar7 + -0x150);
  while (node = pLVar5, node != head) {
    pLVar5 = node->next;
    if (node->refcount < -1) {
      list_remove_free(node,free_value,(void *)0x0);
    }
  }
  pcVar6 = (char *)head;
  iVar2 = list_empty(head);
  quit_application = (int)pcVar6;
  if (iVar2 == 0) {
    lVar7 = 0;
    pLVar5 = head;
    while( true ) {
      quit_application = (int)pcVar6;
      pLVar5 = pLVar5->next;
      if (pLVar5 == head) break;
      puVar1 = (undefined8 *)pLVar5->value;
      cm_print_error("%s function was expected to be called but was not.\n","%s",puVar1[2]);
      pcVar6 = "%s:%u: note: remaining item was declared here\n";
      cm_print_error("%s:%u: note: remaining item was declared here\n",*puVar1,
                     (ulong)*(uint *)(puVar1 + 1));
      lVar7 = lVar7 + -1;
    }
    if ((sVar4 != 0 || sVar3 != 0) || lVar7 != 0) goto LAB_0011ecb6;
  }
  else if (sVar4 != 0 || sVar3 != 0) {
LAB_0011ecb6:
    exit_test(quit_application);
  }
  return;
}

Assistant:

static void fail_if_leftover_values(const char *test_name) {
    int error_occurred = 0;
    (void)test_name;
    remove_always_return_values(&global_function_result_map_head, 1);
    if (check_for_leftover_values(
            &global_function_result_map_head,
            "%s() has remaining non-returned values.\n", 1)) {
        error_occurred = 1;
    }

    remove_always_return_values(&global_function_parameter_map_head, 2);
    if (check_for_leftover_values(
            &global_function_parameter_map_head,
            "'%s' parameter still has values that haven't been checked.\n",
            2)) {
        error_occurred = 1;
    }

    remove_always_return_values_from_list(&global_call_ordering_head);
    if (check_for_leftover_values_list(&global_call_ordering_head,
        "%s function was expected to be called but was not.\n")) {
        error_occurred = 1;
    }
    if (error_occurred) {
        exit_test(1);
    }
}